

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall
QtMWidgets::DateTimePicker::setDateTimeRange(DateTimePicker *this,QDateTime *min,QDateTime *max)

{
  char cVar1;
  QDateTime maximum;
  QDateTime minimum;
  QDateTime aQStack_28 [8];
  QDateTime local_20 [8];
  
  QDateTime::toTimeSpec((TimeSpec)local_20);
  QDateTime::toTimeSpec((TimeSpec)aQStack_28);
  cVar1 = QDateTime::precedes(max);
  if (cVar1 != '\0') {
    QDateTime::operator=(aQStack_28,local_20);
  }
  DateTimePickerPrivate::setRange((this->d).d,local_20,aQStack_28);
  QDateTime::~QDateTime(aQStack_28);
  QDateTime::~QDateTime(local_20);
  return;
}

Assistant:

void
DateTimePicker::setDateTimeRange( const QDateTime & min, const QDateTime & max )
{
	const QDateTime minimum = min.toTimeSpec( d->spec );
	QDateTime maximum = max.toTimeSpec( d->spec );
	if( min > max )
		maximum = minimum;
	d->setRange( minimum, maximum );
}